

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_on_data_received_fail_fast(nghttp2_session *session)

{
  int iVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  uint32_t local_44;
  char *pcStack_40;
  uint32_t error_code;
  char *failure_reason;
  int32_t stream_id;
  nghttp2_inbound_frame *iframe;
  nghttp2_stream *stream;
  int rv;
  nghttp2_session *session_local;
  
  local_44 = 1;
  iVar2 = (session->iframe).frame.hd.stream_id;
  if (iVar2 == 0) {
    pcStack_40 = "DATA: stream_id == 0";
  }
  else {
    iVar1 = session_detect_idle_stream(session,iVar2);
    if (iVar1 == 0) {
      pnVar3 = nghttp2_session_get_stream(session,iVar2);
      if (pnVar3 == (nghttp2_stream *)0x0) {
        pnVar3 = nghttp2_session_get_stream_raw(session,iVar2);
        if ((pnVar3 == (nghttp2_stream *)0x0) || ((pnVar3->shut_flags & 1) == 0)) {
          return -0x68;
        }
        pcStack_40 = "DATA: stream closed";
        local_44 = 5;
      }
      else if ((pnVar3->shut_flags & 1) == 0) {
        iVar2 = nghttp2_session_is_my_stream_id(session,iVar2);
        if (iVar2 == 0) {
          if (pnVar3->state != NGHTTP2_STREAM_RESERVED) {
            if (pnVar3->state == NGHTTP2_STREAM_CLOSING) {
              return -0x68;
            }
            return 0;
          }
          pcStack_40 = "DATA: stream in reserved";
        }
        else {
          if (pnVar3->state == NGHTTP2_STREAM_CLOSING) {
            return -0x68;
          }
          if (pnVar3->state == NGHTTP2_STREAM_OPENED) {
            return 0;
          }
          pcStack_40 = "DATA: stream not opened";
        }
      }
      else {
        pcStack_40 = "DATA: stream in half-closed(remote)";
        local_44 = 5;
      }
    }
    else {
      pcStack_40 = "DATA: stream in idle";
      local_44 = 1;
    }
  }
  session_local._4_4_ = nghttp2_session_terminate_session_with_reason(session,local_44,pcStack_40);
  iVar2 = nghttp2_is_fatal(session_local._4_4_);
  if (iVar2 == 0) {
    session_local._4_4_ = -0x68;
  }
  return session_local._4_4_;
}

Assistant:

static int session_on_data_received_fail_fast(nghttp2_session *session) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_inbound_frame *iframe;
  int32_t stream_id;
  const char *failure_reason;
  uint32_t error_code = NGHTTP2_PROTOCOL_ERROR;

  iframe = &session->iframe;
  stream_id = iframe->frame.hd.stream_id;

  if (stream_id == 0) {
    /* The spec says that if a DATA frame is received whose stream ID
       is 0, the recipient MUST respond with a connection error of
       type PROTOCOL_ERROR. */
    failure_reason = "DATA: stream_id == 0";
    goto fail;
  }

  if (session_detect_idle_stream(session, stream_id)) {
    failure_reason = "DATA: stream in idle";
    error_code = NGHTTP2_PROTOCOL_ERROR;
    goto fail;
  }

  stream = nghttp2_session_get_stream(session, stream_id);
  if (!stream) {
    stream = nghttp2_session_get_stream_raw(session, stream_id);
    if (stream && (stream->shut_flags & NGHTTP2_SHUT_RD)) {
      failure_reason = "DATA: stream closed";
      error_code = NGHTTP2_STREAM_CLOSED;
      goto fail;
    }

    return NGHTTP2_ERR_IGN_PAYLOAD;
  }
  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    failure_reason = "DATA: stream in half-closed(remote)";
    error_code = NGHTTP2_STREAM_CLOSED;
    goto fail;
  }

  if (nghttp2_session_is_my_stream_id(session, stream_id)) {
    if (stream->state == NGHTTP2_STREAM_CLOSING) {
      return NGHTTP2_ERR_IGN_PAYLOAD;
    }
    if (stream->state != NGHTTP2_STREAM_OPENED) {
      failure_reason = "DATA: stream not opened";
      goto fail;
    }
    return 0;
  }
  if (stream->state == NGHTTP2_STREAM_RESERVED) {
    failure_reason = "DATA: stream in reserved";
    goto fail;
  }
  if (stream->state == NGHTTP2_STREAM_CLOSING) {
    return NGHTTP2_ERR_IGN_PAYLOAD;
  }
  return 0;
fail:
  rv = nghttp2_session_terminate_session_with_reason(session, error_code,
                                                     failure_reason);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  return NGHTTP2_ERR_IGN_PAYLOAD;
}